

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void P_UpdatePortal(FLinePortal *port)

{
  line_t *plVar1;
  FLinePortal *pFVar2;
  vertex_t local_40;
  TVector2<double> local_30;
  TVector2<double> local_20;
  FLinePortal *local_10;
  FLinePortal *port_local;
  
  local_10 = port;
  if (port->mDestination == (line_t *)0x0) {
    port->mFlags = '\0';
  }
  else {
    plVar1 = line_t::getPortalDestination(port->mDestination);
    if (plVar1 == local_10->mOrigin) {
      local_10->mFlags = local_10->mDefFlags;
      if (local_10->mType == '\x03') {
        pFVar2 = TArray<FLinePortal,_FLinePortal>::operator[]
                           (&linePortals,(ulong)local_10->mDestination->portalindex);
        if (pFVar2->mType == '\x03') {
          vertex_t::fPos((vertex_t *)&local_30);
          vertex_t::fPos(&local_40);
          TVector2<double>::operator-(&local_20,&local_30);
          TVector2<double>::operator=(&local_10->mDisplacement,&local_20);
        }
        else {
          local_10->mType = '\x02';
        }
      }
    }
    else {
      local_10->mFlags = local_10->mDefFlags & 0xf7;
      if (local_10->mType == '\x03') {
        local_10->mType = '\x01';
        local_10->mDefFlags = local_10->mDefFlags & 0xf7;
      }
    }
  }
  SetRotation(local_10);
  return;
}

Assistant:

void P_UpdatePortal(FLinePortal *port)
{
	if (port->mDestination == NULL)
	{
		// Portal has no destination: switch it off
		port->mFlags = 0;
	}
	else if (port->mDestination->getPortalDestination() != port->mOrigin)
	{
		//portal doesn't link back. This will be a simple teleporter portal.
		port->mFlags = port->mDefFlags & ~PORTF_INTERACTIVE;
		if (port->mType == PORTT_LINKED)
		{
			// this is illegal. Demote the type to TELEPORT
			port->mType = PORTT_TELEPORT;
			port->mDefFlags &= ~PORTF_INTERACTIVE;
		}
	}
	else
	{
		port->mFlags = port->mDefFlags;
		if (port->mType == PORTT_LINKED)
		{
			if (linePortals[port->mDestination->portalindex].mType != PORTT_LINKED)
			{
				port->mType = PORTT_INTERACTIVE;	// linked portals must be two-way.
			}
			else
			{
				port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
			}
		}
 	}

	// Cache the angle between the two linedefs, for rotating.
	SetRotation(port);
}